

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parson.c
# Opt level: O1

void remove_comments(char *string,char *start_token,char *end_token)

{
  bool bVar1;
  bool bVar2;
  char cVar3;
  int iVar4;
  size_t __n;
  size_t sVar5;
  char *pcVar6;
  long lVar7;
  
  __n = strlen(start_token);
  sVar5 = strlen(end_token);
  if ((sVar5 != 0 && __n != 0) && (cVar3 = *string, cVar3 != '\0')) {
    bVar1 = false;
    do {
      lVar7 = 0;
      bVar2 = false;
      while ((!bVar2 && (cVar3 == '\\'))) {
        cVar3 = string[lVar7 + 1];
        lVar7 = lVar7 + 1;
        bVar2 = true;
        if (cVar3 == '\0') {
          return;
        }
      }
      pcVar6 = string + lVar7;
      if (bVar2 || cVar3 != '\"') {
        bVar2 = !bVar1;
        bVar1 = true;
        if (bVar2) {
          iVar4 = strncmp(pcVar6,start_token,__n);
          bVar1 = false;
          if (iVar4 == 0) {
            if (__n != 0) {
              memset(pcVar6,0x20,__n);
            }
            pcVar6 = strstr(string + lVar7 + __n,end_token);
            if (pcVar6 == (char *)0x0) {
              return;
            }
            if (pcVar6 + (((sVar5 - __n) - (long)string) - lVar7) != (char *)0x0) {
              memset(string + lVar7 + __n,0x20,
                     (size_t)(pcVar6 + (((sVar5 - __n) - (long)string) - lVar7)));
            }
            pcVar6 = pcVar6 + (sVar5 - 1);
            bVar1 = false;
          }
        }
      }
      else {
        bVar1 = !bVar1;
      }
      cVar3 = pcVar6[1];
      string = pcVar6 + 1;
    } while (cVar3 != '\0');
  }
  return;
}

Assistant:

static void remove_comments(char *string, const char *start_token, const char *end_token) {
    parson_bool_t in_string = PARSON_FALSE, escaped = PARSON_FALSE;
    size_t i;
    char *ptr = NULL, current_char;
    size_t start_token_len = strlen(start_token);
    size_t end_token_len = strlen(end_token);
    if (start_token_len == 0 || end_token_len == 0) {
        return;
    }
    while ((current_char = *string) != '\0') {
        if (current_char == '\\' && !escaped) {
            escaped = PARSON_TRUE;
            string++;
            continue;
        } else if (current_char == '\"' && !escaped) {
            in_string = !in_string;
        } else if (!in_string && strncmp(string, start_token, start_token_len) == 0) {
            for(i = 0; i < start_token_len; i++) {
                string[i] = ' ';
            }
            string = string + start_token_len;
            ptr = strstr(string, end_token);
            if (!ptr) {
                return;
            }
            for (i = 0; i < (ptr - string) + end_token_len; i++) {
                string[i] = ' ';
            }
            string = ptr + end_token_len - 1;
        }
        escaped = PARSON_FALSE;
        string++;
    }
}